

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

int canvas_undo_arrange(_glist *x,void *z,int action)

{
  _gobj *p_Var1;
  t_gobj *ptVar2;
  int iVar3;
  t_gobj *ptVar4;
  _gobj *p_Var5;
  _gobj *p_Var6;
  t_gobj *ptVar7;
  
  if ((x->field_0xe8 & 0x20) == 0) {
    canvas_editmode(x,1.0);
  }
  if (action == 0) {
    freebytes(z,8);
    return 1;
  }
  if (action == 2) {
    if (*(int *)((long)z + 4) == *z) {
      return 1;
    }
    ptVar7 = x->gl_list;
    if (ptVar7 != (t_gobj *)0x0) {
      iVar3 = *z + 1;
      do {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) goto LAB_0013ebc4;
        ptVar7 = ptVar7->g_next;
      } while (ptVar7 != (_gobj *)0x0);
    }
    ptVar7 = (t_gobj *)0x0;
LAB_0013ebc4:
    glist_noselect(x);
    glist_select(x,ptVar7);
    ptVar4 = x->gl_list;
    if (ptVar4 != ptVar7 && ptVar4 != (t_gobj *)0x0) {
      iVar3 = *z;
      p_Var5 = ptVar4;
      do {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) goto LAB_0013ec00;
        p_Var5 = p_Var5->g_next;
      } while (p_Var5 != (_gobj *)0x0);
    }
    p_Var5 = (t_gobj *)0x0;
LAB_0013ec00:
    iVar3 = -1;
    for (p_Var6 = ptVar4; p_Var6 != (t_gobj *)0x0; p_Var6 = p_Var6->g_next) {
      iVar3 = iVar3 + 1;
    }
    if (ptVar4 != (t_gobj *)0x0) {
      iVar3 = iVar3 + 1;
      p_Var6 = ptVar4;
      do {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) goto LAB_0013ec35;
        p_Var6 = p_Var6->g_next;
      } while (p_Var6 != (_gobj *)0x0);
    }
    p_Var6 = (t_gobj *)0x0;
LAB_0013ec35:
    p_Var1 = ptVar7->g_next;
    if (*(int *)((long)z + 4) == 0) {
      x->gl_list = ptVar7;
      ptVar7->g_next = ptVar4;
      if (p_Var5 == (t_gobj *)0x0) goto LAB_0013ec7f;
      if (p_Var1 == (_gobj *)0x0) {
        p_Var5->g_next = (_gobj *)0x0;
        goto LAB_0013ec7f;
      }
    }
    else {
      p_Var6->g_next = ptVar7;
      ptVar7->g_next = (_gobj *)0x0;
      if (p_Var5 == (t_gobj *)0x0) {
        x->gl_list = p_Var1;
        goto LAB_0013ec7f;
      }
    }
    p_Var5->g_next = p_Var1;
LAB_0013ec7f:
    canvas_dirty(x,1.0);
    return 1;
  }
  if (action != 1) {
    return 1;
  }
  if (*(int *)((long)z + 4) == *z) {
    return 1;
  }
  ptVar7 = x->gl_list;
  if (ptVar7 != (t_gobj *)0x0) {
    iVar3 = *(int *)((long)z + 4) + 1;
    do {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) goto LAB_0013eb42;
      ptVar7 = ptVar7->g_next;
    } while (ptVar7 != (_gobj *)0x0);
  }
  ptVar7 = (t_gobj *)0x0;
LAB_0013eb42:
  glist_noselect(x);
  glist_select(x,ptVar7);
  iVar3 = *(int *)((long)z + 4);
  ptVar4 = x->gl_list;
  ptVar2 = ptVar4;
  if (iVar3 == 0) {
    for (iVar3 = *z; iVar3 != 0; iVar3 = iVar3 + -1) {
      ptVar4 = ptVar4->g_next;
    }
    p_Var5 = ptVar4->g_next;
    x->gl_list = ptVar7->g_next;
  }
  else {
    while (iVar3 = iVar3 + -1, iVar3 != 0) {
      ptVar2 = ptVar2->g_next;
    }
    ptVar2->g_next = (_gobj *)0x0;
    iVar3 = *z;
    if (iVar3 == 0) {
      ptVar7->g_next = ptVar4;
      x->gl_list = ptVar7;
      goto LAB_0013ecbe;
    }
    ptVar4 = x->gl_list;
    while (iVar3 = iVar3 + -1, iVar3 != 0) {
      ptVar4 = ptVar4->g_next;
    }
    p_Var5 = ptVar4->g_next;
  }
  ptVar4->g_next = ptVar7;
  ptVar7->g_next = p_Var5;
LAB_0013ecbe:
  if ((x->field_0xe8 & 1) != 0) {
    canvas_redraw(x);
  }
  return 1;
}

Assistant:

int canvas_undo_arrange(t_canvas *x, void *z, int action)
{
    t_undo_arrange *buf = z;
    t_gobj *y=NULL, *prev=NULL, *next=NULL;

    if (!x->gl_edit)
        canvas_editmode(x, 1);

    switch(action)
    {

    case UNDO_UNDO:
        if(buf->u_newindex == buf->u_previndex) return 1;
            /* this is our object */
        y = glist_nth(x, buf->u_newindex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (buf->u_newindex)
        {
                /* if it is the last object */

                /* first previous object should point to nothing */
            prev = glist_nth(x, buf->u_newindex - 1);
            prev->g_next = NULL;

                /* now we reuse vars for the following:
                   old index should be right before the object previndex
                   is pointing to as the object was moved to the end */

                /* old position is not first */
            if (buf->u_previndex)
            {
                prev = glist_nth(x, buf->u_previndex - 1);
                next = prev->g_next;

                    /* now readjust pointers */
                prev->g_next = y;
                y->g_next = next;
            }
                /* old position is first */
            else {
                prev = NULL;
                next = x->gl_list;

                    /* now readjust pointers */
                y->g_next = next;
                x->gl_list = y;
            }
        }
        else {
                /* if it is the first object */

                /* old index should be right after the object previndex
                   is pointing to as the object was moved to the end */
            prev = glist_nth(x, buf->u_previndex);

                /* next may be NULL and that is ok */
            next = prev->g_next;

                /* first glist pointer needs to point to the second object */
            x->gl_list = y->g_next;

                /* now readjust pointers */
            prev->g_next = y;
            y->g_next = next;
        }
            /* and finally redraw canvas */
        if (x->gl_havewindow)
            canvas_redraw(x);
        break;
    case UNDO_REDO:
    {
        t_gobj *oldy_prev=NULL, *oldy_next=NULL;
        int arrangeaction;

        if(buf->u_newindex == buf->u_previndex) return 1;
            /* find our object */
        y = glist_nth(x, buf->u_previndex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (!buf->u_newindex) arrangeaction = 4;
        else arrangeaction = 3;


            /* if there is an object before ours (in other words our index is > 0) */
        if (glist_getindex(x,y))
            oldy_prev = glist_nth(x, buf->u_previndex - 1);

            /* if there is an object after ours */
        if (y->g_next)
            oldy_next = y->g_next;

        canvas_doarrange(x, arrangeaction, y, oldy_prev, oldy_next);
    }
        break;
    case UNDO_FREE:
        t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}